

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CWorker.hpp
# Opt level: O2

void __thiscall sftm::CWorker::DoWork(CWorker *this)

{
  bool bVar1;
  CTask *pCVar2;
  
  do {
    while( true ) {
      pCVar2 = CConcurrentPtrQueue<sftm::CTask>::Pop(&this->m_taskQueue);
      if (pCVar2 == (CTask *)0x0) break;
      (*pCVar2->_vptr_CTask[2])(pCVar2,this);
      LOCK();
      (pCVar2->m_chainController->m_nCount).super___atomic_base<unsigned_int>._M_i =
           (pCVar2->m_chainController->m_nCount).super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
    }
    bVar1 = FindWork(this);
  } while (bVar1);
  return;
}

Assistant:

void DoWork() noexcept
		{
			do
			{
				while (CTask* pTask = PopTask())
				{
					ExecuteTask(pTask);
				}
			} while (FindWork());
		}